

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

OP1aHeader * __thiscall ASDCP::MXF::OP1aHeader::InitFromBuffer(OP1aHeader *this,byte_t *p,ui32_t l)

{
  Dictionary *Dict;
  int iVar1;
  uint uVar2;
  InterchangeObject *pIVar3;
  ui64_t uVar4;
  byte_t *pbVar5;
  ILogSink *pIVar6;
  PacketList *this_00;
  uint in_ECX;
  undefined4 in_register_00000014;
  IPrimerLookup *local_178;
  undefined1 local_140 [112];
  byte_t *redo_p;
  UL local_68;
  InterchangeObject *local_48;
  InterchangeObject *object;
  byte_t *local_30;
  byte_t *end_p;
  byte_t *pbStack_20;
  ui32_t l_local;
  byte_t *p_local;
  OP1aHeader *this_local;
  Result_t *result;
  
  pbStack_20 = (byte_t *)CONCAT44(in_register_00000014,l);
  p_local = p;
  this_local = this;
  if (*(long *)(p + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x355,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::InitFromBuffer(const byte_t *, ui32_t)"
                 );
  }
  end_p._3_1_ = 0;
  end_p._4_4_ = in_ECX;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  local_30 = pbStack_20 + end_p._4_4_;
  while( true ) {
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar1 < 0 || local_30 <= pbStack_20) {
      return this;
    }
    Dict = *(Dictionary **)(p + 0x78);
    UL::UL(&local_68,pbStack_20);
    pIVar3 = CreateObject(Dict,&local_68);
    UL::~UL(&local_68);
    local_48 = pIVar3;
    if (pIVar3 == (InterchangeObject *)0x0) break;
    local_178 = (IPrimerLookup *)0x0;
    if (p != (byte_t *)0xfffffffffffffec0) {
      local_178 = (IPrimerLookup *)(p + 0x1b0);
    }
    pIVar3->m_Lookup = local_178;
    (*(pIVar3->super_KLVPacket)._vptr_KLVPacket[5])
              (&redo_p,pIVar3,pbStack_20,(ulong)(uint)((int)local_30 - (int)pbStack_20));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&redo_p);
    Kumu::Result_t::~Result_t((Result_t *)&redo_p);
    local_140._104_8_ = pbStack_20;
    uVar4 = KLVPacket::PacketLength(&local_48->super_KLVPacket);
    pbStack_20 = pbStack_20 + uVar4;
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    pIVar3 = local_48;
    if (iVar1 < 0) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar6,"Error initializing OP1a header packet.\n");
      if (local_48 != (InterchangeObject *)0x0) {
        (*(local_48->super_KLVPacket)._vptr_KLVPacket[1])();
      }
    }
    else {
      pbVar5 = Dictionary::ul(*(Dictionary **)(p + 0x78),MDD_KLVFill);
      uVar2 = (*(pIVar3->super_KLVPacket)._vptr_KLVPacket[0xf])(pIVar3,pbVar5);
      pIVar3 = local_48;
      if ((uVar2 & 1) == 0) {
        pbVar5 = Dictionary::ul(*(Dictionary **)(p + 0x78),MDD_Primer);
        uVar2 = (*(pIVar3->super_KLVPacket)._vptr_KLVPacket[0xf])(pIVar3,pbVar5);
        if ((uVar2 & 1) == 0) {
          this_00 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                              ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(p + 0x70));
          Partition::PacketList::AddPacket(this_00,local_48);
          pIVar3 = local_48;
          pbVar5 = Dictionary::ul(*(Dictionary **)(p + 0x78),MDD_Preface);
          uVar2 = (*(pIVar3->super_KLVPacket)._vptr_KLVPacket[0xf])(pIVar3,pbVar5);
          if (((uVar2 & 1) != 0) && (*(long *)(p + 0x210) == 0)) {
            *(InterchangeObject **)(p + 0x210) = local_48;
          }
        }
        else {
          if (local_48 != (InterchangeObject *)0x0) {
            (*(local_48->super_KLVPacket)._vptr_KLVPacket[1])();
          }
          Primer::InitFromBuffer((Primer *)local_140,p + 0x140,(ui32_t)local_140._104_8_);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_140);
          Kumu::Result_t::~Result_t((Result_t *)local_140);
        }
      }
      else {
        if (local_48 != (InterchangeObject *)0x0) {
          (*(local_48->super_KLVPacket)._vptr_KLVPacket[1])();
        }
        if (local_30 < pbStack_20) {
          pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar6,"Fill item short read: %d.\n",(long)pbStack_20 - (long)local_30);
        }
      }
    }
  }
  __assert_fail("object",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x35d,
                "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::InitFromBuffer(const byte_t *, ui32_t)"
               );
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromBuffer(const byte_t* p, ui32_t l)
{
  assert(m_Dict);
  Result_t result = RESULT_OK;
  const byte_t* end_p = p + l;

  while ( ASDCP_SUCCESS(result) && p < end_p )
    {
      // parse the packets and index them by uid, discard KLVFill items
      InterchangeObject* object = CreateObject(m_Dict, p);
      assert(object);

      object->m_Lookup = &m_Primer;
      result = object->InitFromBuffer(p, end_p - p);

      const byte_t* redo_p = p;
      p += object->PacketLength();

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( object->IsA(m_Dict->ul(MDD_KLVFill)) )
	    {
	      delete object;

	      if ( p > end_p )
		{
		  DefaultLogSink().Error("Fill item short read: %d.\n", p - end_p);
		}
	    }
	  else if ( object->IsA(m_Dict->ul(MDD_Primer)) ) // TODO: only one primer should be found
	    {
	      delete object;
	      result = m_Primer.InitFromBuffer(redo_p, end_p - redo_p);
	    }
	  else
	    {
	      m_PacketList->AddPacket(object); // takes ownership

	      if ( object->IsA(m_Dict->ul(MDD_Preface)) && m_Preface == 0 )
		m_Preface = (Preface*)object;
	    }
	}
      else
	{
	  DefaultLogSink().Error("Error initializing OP1a header packet.\n");
	  //	  Kumu::hexdump(p-object->PacketLength(), object->PacketLength());
	  delete object;
	}
    }

  return result;
}